

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

QJsonObject __thiscall FunctionDef::toJson(FunctionDef *this,int index)

{
  QLatin1StringView key;
  QLatin1StringView key_00;
  QLatin1StringView key_01;
  QLatin1StringView key_02;
  QLatin1StringView key_03;
  QLatin1StringView key_04;
  QLatin1StringView key_05;
  bool bVar1;
  const_iterator o;
  QJsonValue *in_RSI;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  ArgumentDef *arg;
  QList<ArgumentDef> *__range1;
  QJsonObject *fdef;
  const_iterator __end1;
  const_iterator __begin1;
  QJsonArray args;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  QCborContainerPrivate *val;
  ArgumentDef *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  QLatin1StringView in_stack_fffffffffffffde8;
  undefined1 auVar3 [12];
  const_iterator local_188;
  undefined1 *local_180;
  QJsonValueConstRef local_178;
  QJsonValueConstRef local_168;
  QJsonValueConstRef local_140;
  QJsonValueConstRef local_118;
  QJsonValueConstRef local_108;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  val = (QCborContainerPrivate *)in_RDI.d.ptr;
  QJsonObject::QJsonObject((QJsonObject *)0x15bb44);
  QString::fromUtf8<void>((QByteArray *)in_RDI.d.ptr);
  QJsonValue::QJsonValue
            ((QJsonValue *)in_RDI.d.ptr,
             (QString *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
  QVar2.m_size = (qsizetype)in_stack_fffffffffffffda8;
  QVar2.m_data = (char *)in_stack_fffffffffffffda0;
  local_108 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,QVar2);
  QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
  QJsonValue::~QJsonValue((QJsonValue *)0x15bbdf);
  QString::~QString((QString *)0x15bbec);
  QJsonValue::QJsonValue((QJsonValue *)in_RDI.d.ptr,in_stack_fffffffffffffd6c);
  Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
  key.m_size = (qsizetype)in_stack_fffffffffffffda8;
  key.m_data = (char *)in_stack_fffffffffffffda0;
  local_118 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key);
  QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
  QJsonValue::~QJsonValue((QJsonValue *)0x15bc6d);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x15bc7b);
  if (!bVar1) {
    QString::fromUtf8<void>((QByteArray *)in_RDI.d.ptr);
    QJsonValue::QJsonValue
              ((QJsonValue *)in_RDI.d.ptr,
               (QString *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
    in_stack_fffffffffffffde8 =
         Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_00.m_size = (qsizetype)in_stack_fffffffffffffda8;
    key_00.m_data = (char *)in_stack_fffffffffffffda0;
    local_140 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_00);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x15bd1b);
    QString::~QString((QString *)0x15bd28);
  }
  QString::fromUtf8<void>((QByteArray *)in_RDI.d.ptr);
  QJsonValue::QJsonValue
            ((QJsonValue *)in_RDI.d.ptr,
             (QString *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
  key_01.m_size = (qsizetype)in_stack_fffffffffffffda8;
  key_01.m_data = (char *)in_stack_fffffffffffffda0;
  local_168 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_01);
  QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
  QJsonValue::~QJsonValue((QJsonValue *)0x15bdb4);
  QString::~QString((QString *)0x15bdc1);
  if (((ulong)in_RSI[8].value.n & 1) != 0) {
    QJsonValue::QJsonValue
              ((QJsonValue *)in_RDI.d.ptr,SUB41((uint)in_stack_fffffffffffffd6c >> 0x18,0));
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_02.m_size = (qsizetype)in_stack_fffffffffffffda8;
    key_02.m_data = (char *)in_stack_fffffffffffffda0;
    local_178 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_02);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x15be42);
  }
  local_180 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)0x15be5e);
  local_188.i = (ArgumentDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_188 = QList<ArgumentDef>::begin((QList<ArgumentDef> *)in_RDI.d.ptr);
  o = QList<ArgumentDef>::end((QList<ArgumentDef> *)in_RDI.d.ptr);
  while( true ) {
    bVar1 = QList<ArgumentDef>::const_iterator::operator!=(&local_188,o);
    auVar3 = in_stack_fffffffffffffde8._4_12_;
    if (!bVar1) break;
    QList<ArgumentDef>::const_iterator::operator*(&local_188);
    ArgumentDef::toJson(in_stack_fffffffffffffda0);
    QJsonValue::QJsonValue(in_RSI,(QJsonObject *)val);
    QJsonArray::append((QJsonArray *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x15bf55);
    QJsonObject::~QJsonObject((QJsonObject *)0x15bf62);
    QList<ArgumentDef>::const_iterator::operator++(&local_188);
  }
  bVar1 = QJsonArray::isEmpty((QJsonArray *)in_RSI);
  if (!bVar1) {
    QJsonValue::QJsonValue(in_RSI,(QJsonArray *)val);
    QVar2 = Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    in_stack_fffffffffffffda8 = QVar2.m_data;
    key_03.m_size = (qsizetype)in_stack_fffffffffffffda8;
    key_03.m_data = (char *)in_stack_fffffffffffffda0;
    QJsonObject::operator[]((QJsonObject *)val,key_03);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x15bffb);
  }
  accessToJson(auVar3._4_8_,auVar3._0_4_);
  if (0 < *(int *)&in_RSI[7].value.field_0x14) {
    QJsonValue::QJsonValue((QJsonValue *)in_RDI.d.ptr,in_stack_fffffffffffffd6c);
    QVar2 = Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    in_stack_fffffffffffffda0 = (ArgumentDef *)QVar2.m_size;
    key_04.m_size = (qsizetype)in_stack_fffffffffffffda8;
    key_04.m_data = (char *)in_stack_fffffffffffffda0;
    QJsonObject::operator[]((QJsonObject *)val,key_04);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x15c097);
  }
  if ((in_RSI[8].value.n & 0x100000000) != 0) {
    QJsonValue::QJsonValue
              ((QJsonValue *)in_RDI.d.ptr,SUB41((uint)in_stack_fffffffffffffd6c >> 0x18,0));
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_05.m_size = (qsizetype)in_stack_fffffffffffffda8;
    key_05.m_data = (char *)in_stack_fffffffffffffda0;
    QJsonObject::operator[]((QJsonObject *)val,key_05);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x15c118);
  }
  QJsonArray::~QJsonArray((QJsonArray *)0x15c12d);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
}

Assistant:

QJsonObject FunctionDef::toJson(int index) const
{
    QJsonObject fdef;
    fdef["name"_L1] = QString::fromUtf8(name);
    fdef["index"_L1] = index;
    if (!tag.isEmpty())
        fdef["tag"_L1] = QString::fromUtf8(tag);
    fdef["returnType"_L1] = QString::fromUtf8(normalizedType);
    if (isConst)
        fdef["isConst"_L1] = true;

    QJsonArray args;
    for (const ArgumentDef &arg: arguments)
        args.append(arg.toJson());

    if (!args.isEmpty())
        fdef["arguments"_L1] = args;

    accessToJson(&fdef, access);

    if (revision > 0)
        fdef["revision"_L1] = revision;

    if (wasCloned)
        fdef["isCloned"_L1] = true;

    return fdef;
}